

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-open.c
# Opt level: O1

void recv_cb(uv_udp_t *handle,ssize_t nread,uv_buf_t *buf,sockaddr *addr,uint flags)

{
  recv_cb_called = recv_cb_called + 1;
  return;
}

Assistant:

static void recv_cb(uv_udp_t* handle,
                       ssize_t nread,
                       const uv_buf_t* buf,
                       const struct sockaddr* addr,
                       unsigned flags) {
  int r;

  if (nread < 0) {
    ASSERT(0 && "unexpected error");
  }

  if (nread == 0) {
    /* Returning unused buffer. Don't count towards sv_recv_cb_called */
    ASSERT_NULL(addr);
    return;
  }

  ASSERT_OK(flags);

  ASSERT_NOT_NULL(addr);
  ASSERT_EQ(4, nread);
  ASSERT_OK(memcmp("PING", buf->base, nread));

  r = uv_udp_recv_stop(handle);
  ASSERT_OK(r);

  uv_close((uv_handle_t*) handle, close_cb);
}